

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenDataDropSetSegment(BinaryenExpressionRef expr,char *segment)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id == DataDropId) {
    this = (IString *)strlen(segment);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)segment;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    *(string_view *)(expr + 1) = sVar1;
    return;
  }
  __assert_fail("expression->is<DataDrop>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xdbf,"void BinaryenDataDropSetSegment(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenDataDropSetSegment(BinaryenExpressionRef expr,
                                const char* segment) {
  auto* expression = (Expression*)expr;
  assert(expression->is<DataDrop>());
  static_cast<DataDrop*>(expression)->segment = Name(segment);
}